

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_fix.cpp
# Opt level: O0

void Omega_h::fix_for_given_metric(Mesh *mesh,AdaptOpts *adapt_opts,bool verbose)

{
  ostream *poVar1;
  Real RVar2;
  double dVar3;
  double local_200;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1c0;
  Real minqual_old;
  AdaptOpts opts;
  Real maxlen;
  Real minqual;
  bool verbose_local;
  AdaptOpts *adapt_opts_local;
  Mesh *mesh_local;
  
  if (verbose) {
    std::operator<<((ostream *)&std::cout,"computing minimum quality\n");
  }
  maxlen = Mesh::min_quality(mesh);
  opts.xfer_opts.user_xfer.super___shared_ptr<Omega_h::UserTransfer,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)Mesh::max_length(mesh);
  if (verbose) {
    poVar1 = std::operator<<((ostream *)&std::cout,"minimum quality ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,maxlen);
    std::operator<<(poVar1,'\n');
    poVar1 = std::operator<<((ostream *)&std::cout,"maximum length ");
    poVar1 = (ostream *)
             std::ostream::operator<<
                       (poVar1,(double)opts.xfer_opts.user_xfer.
                                       super___shared_ptr<Omega_h::UserTransfer,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount._M_pi);
    std::operator<<(poVar1,'\n');
  }
  AdaptOpts::AdaptOpts((AdaptOpts *)&minqual_old,adapt_opts);
  do {
    opts.max_length_allowed = maxlen;
    local_1c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(opts.min_length_desired * 2.0);
    if ((double)local_1c0 <=
        (double)opts.xfer_opts.user_xfer.
                super___shared_ptr<Omega_h::UserTransfer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi) {
      local_1c0 = opts.xfer_opts.user_xfer.
                  super___shared_ptr<Omega_h::UserTransfer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
    }
    opts.max_length_desired = (Real)local_1c0;
    poVar1 = std::operator<<((ostream *)&std::cout,"max_length_allowed(");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,opts.max_length_desired);
    poVar1 = std::operator<<(poVar1,") = max(");
    poVar1 = std::operator<<(poVar1,"maxlen(");
    poVar1 = (ostream *)
             std::ostream::operator<<
                       (poVar1,(double)opts.xfer_opts.user_xfer.
                                       super___shared_ptr<Omega_h::UserTransfer,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount._M_pi);
    poVar1 = std::operator<<(poVar1,"), max_length_desired*2(");
    poVar1 = (ostream *)
             std::ostream::operator<<(poVar1,opts.min_length_desired + opts.min_length_desired);
    std::operator<<(poVar1,"))\n");
    opts.min_quality_desired._4_4_ = 3;
    opts.min_quality_desired._0_4_ = 10;
    local_200 = maxlen + 0.1;
    if (1.0 < local_200) {
      local_200 = 1.0;
    }
    opts.min_quality_allowed = local_200;
    adapt(mesh,(AdaptOpts *)&minqual_old);
    RVar2 = Mesh::min_quality(mesh);
    opts.xfer_opts.user_xfer.super___shared_ptr<Omega_h::UserTransfer,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)Mesh::max_length(mesh);
    if (verbose) {
      poVar1 = std::operator<<((ostream *)&std::cout,"minimum quality ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,RVar2);
      std::operator<<(poVar1,'\n');
      poVar1 = std::operator<<((ostream *)&std::cout,"maximum length ");
      poVar1 = (ostream *)
               std::ostream::operator<<
                         (poVar1,(double)opts.xfer_opts.user_xfer.
                                         super___shared_ptr<Omega_h::UserTransfer,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount._M_pi);
      std::operator<<(poVar1,'\n');
    }
    dVar3 = maxlen + 0.001;
    maxlen = RVar2;
  } while (dVar3 <= RVar2);
  AdaptOpts::~AdaptOpts((AdaptOpts *)&minqual_old);
  return;
}

Assistant:

void fix_for_given_metric(
    Mesh* mesh, AdaptOpts const& adapt_opts, bool verbose) {
  if (verbose) std::cout << "computing minimum quality\n";
  auto minqual = mesh->min_quality();
  auto maxlen = mesh->max_length();
  if (verbose) std::cout << "minimum quality " << minqual << '\n';
  if (verbose) std::cout << "maximum length " << maxlen << '\n';
  AdaptOpts opts = adapt_opts;
  while (true) {
    auto minqual_old = minqual;
    opts.min_quality_allowed = minqual;
    opts.max_length_allowed = max2(maxlen, opts.max_length_desired * 2.0);
    std::cout << "max_length_allowed(" << opts.max_length_allowed << ") = max("
              << "maxlen(" << maxlen << "), max_length_desired*2("
              << opts.max_length_desired * 2.0 << "))\n";
    opts.verbosity = EXTRA_STATS;
    opts.nsliver_layers = 10;
    opts.min_quality_desired = min2(minqual + 0.1, 1.0);
#ifdef OMEGA_H_USE_EGADS
    opts.allow_snap_failure = true;
#endif
    adapt(mesh, opts);
    minqual = mesh->min_quality();
    maxlen = mesh->max_length();
    if (verbose) std::cout << "minimum quality " << minqual << '\n';
    if (verbose) std::cout << "maximum length " << maxlen << '\n';
    if (minqual < minqual_old + 1e-3) break;  // stalled
  }
}